

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_code.hpp
# Opt level: O2

string_ref * __thiscall
system_error2::_generic_code_domain::name
          (string_ref *__return_storage_ptr__,_generic_code_domain *this)

{
  size_t sVar1;
  
  __return_storage_ptr__->_begin = "generic domain";
  sVar1 = detail::cstrlen("generic domain");
  __return_storage_ptr__->_end = "generic domain" + sVar1;
  __return_storage_ptr__->_state[2] = (void *)0x0;
  __return_storage_ptr__->_state[0] = (void *)0x0;
  __return_storage_ptr__->_state[1] = (void *)0x0;
  __return_storage_ptr__->_thunk = status_code_domain::string_ref::_checking_string_thunk;
  return __return_storage_ptr__;
}

Assistant:

virtual payload_info_t payload_info() const noexcept override
  {
    return {sizeof(value_type), sizeof(status_code_domain *) + sizeof(value_type),
            (alignof(value_type) > alignof(status_code_domain *)) ? alignof(value_type) : alignof(status_code_domain *)};
  }